

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int libssh2_knownhost_readfile(LIBSSH2_KNOWNHOSTS *hosts,char *filename,int type)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t len;
  char local_1038 [8];
  char buf [4092];
  int local_34;
  int num;
  FILE *file;
  int type_local;
  char *filename_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  local_34 = 0;
  if (type == 1) {
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      hosts_local._4_4_ = _libssh2_error(hosts->session,-0x10,"Failed to open file");
    }
    else {
      while (pcVar2 = fgets(local_1038,0xffc,__stream), pcVar2 != (char *)0x0) {
        len = strlen(local_1038);
        iVar1 = libssh2_knownhost_readline(hosts,local_1038,len,1);
        if (iVar1 != 0) {
          local_34 = _libssh2_error(hosts->session,-0x2e,"Failed to parse known hosts file");
          break;
        }
        local_34 = local_34 + 1;
      }
      fclose(__stream);
      hosts_local._4_4_ = local_34;
    }
  }
  else {
    hosts_local._4_4_ =
         _libssh2_error(hosts->session,-0x21,"Unsupported type of known-host information store");
  }
  return hosts_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_readfile(LIBSSH2_KNOWNHOSTS *hosts,
                           const char *filename, int type)
{
    FILE *file;
    int num = 0;
    char buf[4092];

    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    file = fopen(filename, FOPEN_READTEXT);
    if(file) {
        while(fgets(buf, sizeof(buf), file)) {
            if(libssh2_knownhost_readline(hosts, buf, strlen(buf), type)) {
                num = _libssh2_error(hosts->session, LIBSSH2_ERROR_KNOWN_HOSTS,
                                     "Failed to parse known hosts file");
                break;
            }
            num++;
        }
        fclose(file);
    }
    else
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                              "Failed to open file");

    return num;
}